

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_get.cpp
# Opt level: O1

FilterPropagateResult __thiscall
duckdb::StatisticsPropagator::PropagateTableFilter
          (StatisticsPropagator *this,ColumnBinding stats_binding,BaseStatistics *stats,
          TableFilter *filter)

{
  FilterPropagateResult FVar1;
  int iVar2;
  ExpressionFilter *pEVar3;
  BoundColumnRefExpression *this_00;
  type pBVar4;
  type condition;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> filter_expr;
  templated_unique_single_t column_ref;
  LogicalType local_50;
  _Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false> local_38;
  
  if (filter->filter_type == EXPRESSION_FILTER) {
    pEVar3 = TableFilter::Cast<duckdb::ExpressionFilter>(filter);
    this_00 = (BoundColumnRefExpression *)operator_new(0x70);
    LogicalType::LogicalType(&local_50,&stats->type);
    BoundColumnRefExpression::BoundColumnRefExpression(this_00,&local_50,stats_binding,0);
    local_38._M_head_impl = this_00;
    LogicalType::~LogicalType(&local_50);
    pBVar4 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
             ::operator*((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                          *)&local_38);
    (*(pEVar3->super_TableFilter)._vptr_TableFilter[6])(&local_50,pEVar3,pBVar4);
    condition = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_50);
    UpdateFilterStatistics(this,condition);
    FVar1 = HandleFilter(this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_50);
    if ((long *)local_50._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 8))();
    }
    if (local_38._M_head_impl != (BoundColumnRefExpression *)0x0) {
      (*((local_38._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    return FVar1;
  }
  iVar2 = (*filter->_vptr_TableFilter[2])(filter,stats);
  return (FilterPropagateResult)iVar2;
}

Assistant:

FilterPropagateResult StatisticsPropagator::PropagateTableFilter(ColumnBinding stats_binding, BaseStatistics &stats,
                                                                 TableFilter &filter) {
	if (filter.filter_type == TableFilterType::EXPRESSION_FILTER) {
		auto &expr_filter = filter.Cast<ExpressionFilter>();
		auto column_ref = make_uniq<BoundColumnRefExpression>(stats.GetType(), stats_binding);
		auto filter_expr = expr_filter.ToExpression(*column_ref);
		UpdateFilterStatistics(*filter_expr);
		return HandleFilter(filter_expr);
	}
	return filter.CheckStatistics(stats);
}